

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall
pybind11::capsule::capsule(capsule *this,void *value,_func_void_void_ptr *destructor)

{
  int iVar1;
  _func_void_PyObject_ptr *p_Var2;
  long lVar3;
  undefined8 uVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  error_already_set *in_stack_ffffffffffffffd0;
  _lambda__object___1_ local_19;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  object::object((object *)0x2b2422);
  p_Var2 = capsule(void_const*,void(*)(void*))::{lambda(_object*)#1}::
           operator_cast_to_function_pointer(&local_19);
  lVar3 = PyCapsule_New(local_10,0,p_Var2);
  *in_RDI = lVar3;
  if (*in_RDI != 0) {
    iVar1 = PyCapsule_SetContext(*in_RDI,local_18);
    if (iVar1 == 0) {
      return;
    }
  }
  uVar4 = __cxa_allocate_exception(0x18);
  error_already_set::error_already_set(in_stack_ffffffffffffffd0);
  __cxa_throw(uVar4,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

capsule(const void *value, void (*destructor)(void *)) {
        m_ptr = PyCapsule_New(const_cast<void *>(value), nullptr, [](PyObject *o) {
            // guard if destructor called while err indicator is set
            error_scope error_guard;
            auto destructor = reinterpret_cast<void (*)(void *)>(PyCapsule_GetContext(o));
            if (destructor == nullptr && PyErr_Occurred()) {
                throw error_already_set();
            }
            const char *name = get_name_in_error_scope(o);
            void *ptr = PyCapsule_GetPointer(o, name);
            if (ptr == nullptr) {
                throw error_already_set();
            }

            if (destructor != nullptr) {
                destructor(ptr);
            }
        });

        if (!m_ptr || PyCapsule_SetContext(m_ptr, reinterpret_cast<void *>(destructor)) != 0) {
            throw error_already_set();
        }
    }